

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeBinaryOp(ExpressionContext *ctx,SynBinaryOp *syntax)

{
  SynBinaryOpType type;
  undefined4 uVar1;
  SynBase *synValue;
  int iVar2;
  ExprBase *pEVar3;
  char *__s;
  size_t sVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  TypeBase *pTVar7;
  InplaceStr IVar8;
  ExprBase *pEVar6;
  
  pEVar3 = AnalyzeExpression(ctx,syntax->lhs);
  type = *(SynBinaryOpType *)&(syntax->super_SynBase).field_0x3c;
  if ((((type & ~SYN_BINARY_OP_ADD) == SYN_BINARY_OP_LOGICAL_AND) &&
      (pEVar3->type != (TypeBase *)0x0)) && (pEVar3->type->typeID == 0x18)) {
    __s = GetOpName(type);
    sVar4 = strlen(__s);
    synValue = syntax->rhs;
    IVar8 = GetTemporaryFunctionName(ctx);
    pEVar5 = CreateValueFunctionWrapper(ctx,&syntax->super_SynBase,synValue,(ExprBase *)0x0,IVar8);
    IVar8.end = __s + sVar4;
    IVar8.begin = __s;
    pEVar5 = CreateFunctionCall2(ctx,&syntax->super_SynBase,IVar8,pEVar3,pEVar5,true,false,true);
    if (pEVar5 != (ExprBase *)0x0) {
      return pEVar5;
    }
  }
  pEVar5 = AnalyzeExpression(ctx,syntax->rhs);
  if (((pEVar3->type == (TypeBase *)0x0) || (pEVar3->type->typeID != 0)) &&
     ((pEVar5->type == (TypeBase *)0x0 || (pEVar5->type->typeID != 0)))) {
    pEVar3 = CreateBinaryOp(ctx,&syntax->super_SynBase,
                            *(SynBinaryOpType *)&(syntax->super_SynBase).field_0x3c,pEVar3,pEVar5);
    return pEVar3;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar2);
  pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  uVar1 = *(undefined4 *)&(syntax->super_SynBase).field_0x3c;
  pEVar6->typeID = 0x14;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = pTVar7;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223be0;
  *(undefined4 *)&pEVar6->field_0x2c = uVar1;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar3;
  *(ExprBase **)&pEVar6[1].typeID = pEVar5;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeBinaryOp(ExpressionContext &ctx, SynBinaryOp *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);

	// For && and || try to find a function that accepts a wrapped right-hand-side evaluation
	if((syntax->type == SYN_BINARY_OP_LOGICAL_AND || syntax->type == SYN_BINARY_OP_LOGICAL_OR) && isType<TypeClass>(lhs->type))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, CreateValueFunctionWrapper(ctx, syntax, syntax->rhs, NULL, GetTemporaryFunctionName(ctx)), true, false, true))
			return result;
	}

	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(syntax, ctx.GetErrorType(), syntax->type, lhs, rhs);

	return CreateBinaryOp(ctx, syntax, syntax->type, lhs, rhs);
}